

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WriteArray<bool>(bool *a,int n,CodedOutputStream *output)

{
  int in_ESI;
  void *in_RDI;
  
  io::CodedOutputStream::WriteRaw(output,in_RDI,in_ESI);
  return;
}

Assistant:

static void WriteArray(const CType* a, int n, io::CodedOutputStream* output) {
#if defined(PROTOBUF_LITTLE_ENDIAN)
  output->WriteRaw(reinterpret_cast<const char*>(a), n * sizeof(a[0]));
#else
  const int kAtATime = 128;
  uint8 buf[sizeof(CType) * kAtATime];
  for (int i = 0; i < n; i += kAtATime) {
    int to_do = std::min(kAtATime, n - i);
    uint8* ptr = buf;
    for (int j = 0; j < to_do; j++) {
      EncodeFixedSizeValue(a[i + j], ptr);
      ptr += sizeof(a[0]);
    }
    output->WriteRaw(buf, to_do * sizeof(a[0]));
  }
#endif
}